

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

int __thiscall Imf_3_3::DeepTiledInputFile::levelWidth(DeepTiledInputFile *this,int lx)

{
  exr_result_t eVar1;
  ostream *poVar2;
  char *pcVar3;
  stringstream *text;
  exr_const_context_t in_RDI;
  stringstream _iex_throw_s;
  int32_t levw;
  int32_t *in_stack_fffffffffffffe28;
  int32_t *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  int levely;
  undefined8 in_stack_fffffffffffffe40;
  stringstream local_198 [16];
  ostream local_188 [376];
  int local_10;
  
  levely = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  local_10 = 0;
  Context::operator_cast_to__priv_exr_context_t_((Context *)0x1b4c23);
  std::
  __shared_ptr_access<Imf_3_3::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Imf_3_3::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1b4c36);
  eVar1 = exr_get_level_sizes(in_RDI,(int)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                              (int)in_stack_fffffffffffffe40,levely,in_stack_fffffffffffffe30,
                              in_stack_fffffffffffffe28);
  if (eVar1 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_198);
    poVar2 = std::operator<<(local_188,"Error calling levelWidth() on image file \"");
    pcVar3 = fileName((DeepTiledInputFile *)0x1b4c98);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,"\".");
    text = (stringstream *)__cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc((ArgExc *)poVar2,text);
    __cxa_throw(text,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  return local_10;
}

Assistant:

int
DeepTiledInputFile::levelWidth (int lx) const
{
    int32_t levw = 0;
    if (EXR_ERR_SUCCESS != exr_get_level_sizes (
            _ctxt, _data->partNumber, lx, 0, &levw, nullptr))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Error calling levelWidth() on image "
            "file \""
                << fileName () << "\".");
    }
    return levw;
}